

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_free_prop_enum(JSContext *ctx,JSPropertyEnum *tab,uint32_t len)

{
  ulong uVar1;
  
  if (tab != (JSPropertyEnum *)0x0) {
    for (uVar1 = 0; len != uVar1; uVar1 = uVar1 + 1) {
      JS_FreeAtom(ctx,tab[uVar1].atom);
    }
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,tab);
    return;
  }
  return;
}

Assistant:

static void js_free_prop_enum(JSContext *ctx, JSPropertyEnum *tab, uint32_t len)
{
    uint32_t i;
    if (tab) {
        for(i = 0; i < len; i++)
            JS_FreeAtom(ctx, tab[i].atom);
        js_free(ctx, tab);
    }
}